

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void expr_table(LexState *ls,ExpDesc *e)

{
  MSize MVar1;
  FuncState *fs;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BCPos BVar7;
  uint uVar8;
  BCReg BVar9;
  ExpKind EVar10;
  int iVar11;
  LexToken LVar12;
  GCstr *pGVar13;
  GCobj *gc;
  TValue *pTVar14;
  ushort uVar15;
  anon_union_8_3_2ce71dea_for_u aVar16;
  uint32_t hbits;
  uint32_t asize;
  long lVar17;
  uint uVar18;
  GCobj *o;
  BCInsLine *pBVar19;
  uint32_t uVar20;
  ExpDesc en;
  TValue k;
  ExpDesc val;
  cTValue local_88;
  uint uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  BCPos local_70;
  BCReg local_6c;
  cTValue local_68;
  anon_union_8_3_2ce71dea_for_u local_60;
  uint local_58;
  int local_54;
  int local_50;
  BCLine local_44;
  ulong local_40;
  ulong local_38;
  
  fs = ls->fs;
  local_44 = ls->linenumber;
  BVar9 = fs->freereg;
  local_38 = (ulong)(BVar9 * 0x100);
  BVar7 = bcemit_INS(fs,BVar9 * 0x100 + 0x34);
  e->k = VNONRELOC;
  (e->u).s.info = BVar9;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  uVar20 = 1;
  bcreg_reserve(fs,1);
  local_6c = BVar9 + 1;
  lex_check(ls,0x7b);
  iVar11 = ls->tok;
  local_70 = BVar7;
  if (iVar11 == 0x7d) {
    uVar18 = 0;
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    gc = (GCobj *)0x0;
  }
  else {
    local_40 = (ulong)BVar7;
    uVar20 = 1;
    gc = (GCobj *)0x0;
    bVar5 = false;
    bVar6 = false;
    uVar18 = 0;
    do {
      if ((iVar11 == 0x11f) || (iVar11 == 0x10a)) {
        LVar12 = lj_lex_lookahead(ls);
        if (LVar12 == 0x3d) {
          uStack_80 = 3;
          uStack_7c = 0xffffffff;
          local_88.field_4.i = 0;
          uStack_78 = 0xffffffff;
          pGVar13 = lex_str(ls);
          local_88.field_4.i = (int32_t)pGVar13;
          local_88.field_4.it = (uint32_t)((ulong)pGVar13 >> 0x20);
          lex_check(ls,0x3d);
          uVar18 = uVar18 + 1;
          goto LAB_00121b97;
        }
LAB_00121b9b:
        uStack_80 = 4;
        uStack_7c = 0xffffffff;
        uStack_78 = 0xffffffff;
        local_88.n = (lua_Number)(int)uVar20;
        uVar20 = uVar20 + 1;
        bVar5 = true;
        bVar4 = true;
      }
      else {
        if (iVar11 != 0x5b) goto LAB_00121b9b;
        expr_bracket(ls,(ExpDesc *)&local_88.gcr);
        if (4 < uStack_80) {
          expr_index(fs,e,(ExpDesc *)&local_88.gcr);
        }
        if ((uStack_80 == 4) && (ABS((double)local_88.u64) == 0.0)) {
          bVar5 = true;
        }
        else {
          uVar18 = uVar18 + 1;
        }
        lex_check(ls,0x3d);
LAB_00121b97:
        bVar4 = false;
      }
      expr_binop(ls,(ExpDesc *)&local_60.s,0);
      if ((uStack_80 - 1 < 4) && ((uStack_80 == 3 || ((local_58 < 5 && (local_54 == local_50)))))) {
        if (gc == (GCobj *)0x0) {
          asize = uVar20;
          if (!bVar5) {
            asize = 0;
          }
          uVar8 = 0x1f;
          if (uVar18 - 1 != 0) {
            for (; uVar18 - 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          hbits = (uVar8 ^ 0xffffffe0) + 0x21;
          if (uVar18 < 2) {
            hbits = uVar18;
          }
          gc = (GCobj *)lj_tab_new(fs->L,asize,hbits);
          BVar9 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[local_40].ins = BVar9 << 0x10 | (uint)local_38 | 0x35;
        }
        if ((ulong)uStack_80 < 3) {
          local_68.u64 = ~((ulong)uStack_80 << 0x2f);
        }
        else {
          local_68 = local_88;
          if (uStack_80 == 3) {
            local_68.u64 = local_88.u64 | 0xfffd800000000000;
          }
        }
        pTVar14 = lj_tab_set(fs->L,&gc->tab,&local_68);
        if (((gc->gch).marked & 4) != 0) {
          uVar2 = (fs->L->glref).ptr64;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr64 = *(uint64_t *)(uVar2 + 0x40);
          *(GCobj **)(uVar2 + 0x40) = gc;
        }
        if (((ulong)local_58 < 5) && (local_54 == local_50)) {
          if (local_58 < 3) {
            aVar16.sval = (GCstr *)~((ulong)local_58 << 0x2f);
          }
          else {
            if (local_58 != 3) {
              bVar3 = true;
              aVar16 = local_60;
              goto LAB_00121d04;
            }
            aVar16.s = local_60.s | 0xfffd800000000000;
          }
          bVar3 = true;
        }
        else {
          aVar16.sval = (GCstr *)((ulong)gc | 0xfffa000000000000);
          bVar6 = true;
          bVar3 = false;
        }
LAB_00121d04:
        pTVar14->u64 = (uint64_t)aVar16;
        bVar4 = false;
        if (!bVar3) goto LAB_00121d0d;
      }
      else {
LAB_00121d0d:
        if (local_58 != 0xd) {
          expr_toanyreg(fs,(ExpDesc *)&local_60.s);
          bVar4 = false;
        }
        if (uStack_80 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_88.gcr);
        }
        bcemit_store(fs,e,(ExpDesc *)&local_60.s);
      }
      fs->freereg = local_6c;
      if ((ls->tok != 0x2c) && (ls->tok != 0x3b)) break;
      lj_lex_next(ls);
      iVar11 = ls->tok;
    } while (iVar11 != 0x7d);
  }
  lex_match(ls,0x7d,0x7b,local_44);
  if (bVar4) {
    uVar8 = fs->pc - 1;
    pBVar19 = fs->bcbase + uVar8;
    uStack_7c = 0xffffffff;
    uStack_78 = 0xffffffff;
    local_88.field_4.i = uVar20 - 1;
    local_88.field_4.it = 0x43300000;
    uStack_80 = 4;
    if (0x100 < uVar20) {
      fs->pc = uVar8;
      pBVar19 = pBVar19 + -1;
    }
    uVar8 = local_6c << 8;
    BVar9 = const_num(fs,(ExpDesc *)&local_88.gcr);
    pBVar19->ins = BVar9 << 0x10 | uVar8 | 0x3f;
    *(undefined1 *)((long)&pBVar19[-1].ins + 3) = 0;
  }
  EVar10 = VNONRELOC;
  if (local_70 == fs->pc - 1) {
    (e->u).s.info = local_70;
    fs->freereg = fs->freereg - 1;
    EVar10 = VRELOCABLE;
  }
  e->k = EVar10;
  if (gc == (GCobj *)0x0) {
    if (bVar5) {
      uVar15 = 3;
      if (2 < uVar20) {
        uVar8 = 0x7ff;
        if (uVar20 < 0x7ff) {
          uVar8 = uVar20;
        }
        uVar15 = (ushort)uVar8;
      }
    }
    else {
      uVar15 = 0;
    }
    if (uVar18 != 0) {
      if (uVar18 == 1) {
        uVar18 = 0x800;
      }
      else {
        uVar8 = 0x1f;
        if (uVar18 - 1 != 0) {
          for (; uVar18 - 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar18 = (uVar8 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[local_70].ins + 2) = (ushort)uVar18 | uVar15;
  }
  else {
    if ((bVar5) && ((gc->pt).sizekgc < uVar20)) {
      lj_tab_reasize(fs->L,&gc->tab,uVar20 - 1);
    }
    if (bVar6) {
      pTVar14 = (gc->th).top;
      MVar1 = (gc->pt).sizekn;
      lVar17 = 0;
      do {
        if ((*(ulong *)((long)pTVar14 + lVar17) & 0xffff800000000000) == 0xfffa000000000000) {
          *(undefined8 *)((long)pTVar14 + lVar17) = 0xffffffffffffffff;
        }
        lVar17 = lVar17 + 0x18;
      } while ((ulong)(MVar1 + 1 + (uint)(MVar1 == 0xffffffff)) * 0x18 != lVar17);
    }
    uVar2 = (fs->L->glref).ptr64;
    if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->tok != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->tok == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(fs, &k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(fs, v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lj_assertFS(bc_a(ilp->ins) == freg &&
		bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB),
		"bad CALL code generation");
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lj_assertFS(tabV(&n->val) == t, "bad dummy key in template table");
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}